

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChCollisionAlgorithmsBullet.cpp
# Opt level: O1

void __thiscall
chrono::collision::cbtArcArcCollisionAlgorithm::processCollision
          (cbtArcArcCollisionAlgorithm *this,cbtCollisionObjectWrapper *body0,
          cbtCollisionObjectWrapper *body1,cbtDispatcherInfo *dispatchInfo,
          cbtManifoldResult *resultOut)

{
  cbtScalar cVar1;
  cbtScalar cVar2;
  uint uVar3;
  uint uVar4;
  float fVar5;
  cbtPersistentManifold *this_00;
  cbtCollisionObject *pcVar6;
  cbtCollisionObject *pcVar7;
  cbtCollisionShape *pcVar8;
  cbtCollisionShape *pcVar9;
  float fVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  undefined1 auVar18 [16];
  byte bVar19;
  int iVar20;
  long lVar21;
  cbtManifoldPoint *pt;
  cbtCollisionObjectWrapper *pcVar22;
  byte bVar23;
  byte bVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  undefined1 auVar41 [16];
  double dVar38;
  double dVar39;
  undefined1 auVar42 [16];
  double dVar37;
  undefined8 extraout_XMM0_Qb;
  undefined1 auVar40 [16];
  undefined1 auVar43 [64];
  undefined1 extraout_var_00 [56];
  undefined1 auVar44 [64];
  undefined1 auVar45 [64];
  undefined1 auVar46 [64];
  undefined1 auVar47 [64];
  undefined1 auVar48 [64];
  ulong extraout_XMM0_Qb_00;
  undefined8 extraout_XMM0_Qb_01;
  undefined8 extraout_XMM0_Qb_02;
  undefined8 extraout_XMM0_Qb_03;
  undefined8 extraout_XMM0_Qb_04;
  undefined1 auVar49 [64];
  undefined1 auVar50 [64];
  undefined1 auVar51 [64];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [64];
  undefined1 auVar57 [64];
  double dVar59;
  undefined1 auVar61 [12];
  undefined1 auVar60 [64];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  float fVar67;
  undefined1 in_ZMM25 [64];
  undefined1 in_XMM26 [16];
  cbtVector3 cVar68;
  cbtVector3 normal_on_2;
  cbtVector3 pos2;
  undefined1 local_138 [16];
  undefined1 local_118 [16];
  cbtVector3 local_98;
  double local_88;
  undefined8 uStack_80;
  double local_78;
  undefined8 uStack_70;
  cbtVector3 local_60;
  undefined1 local_50 [16];
  undefined1 local_40 [16];
  undefined1 extraout_var [60];
  undefined1 extraout_var_01 [56];
  undefined1 extraout_var_02 [56];
  undefined1 extraout_var_03 [56];
  undefined1 extraout_var_04 [56];
  undefined1 extraout_var_05 [56];
  undefined1 extraout_var_06 [56];
  undefined1 auVar52 [56];
  undefined1 auVar58 [56];
  
  auVar27 = in_ZMM25._0_16_;
  this_00 = this->m_manifoldPtr;
  if (this_00 == (cbtPersistentManifold *)0x0) {
    return;
  }
  pcVar22 = body1;
  if (this->m_isSwapped != false) {
    pcVar22 = body0;
    body0 = body1;
  }
  resultOut->m_manifoldPtr = this_00;
  iVar20 = this_00->m_cachedPoints;
  if (0 < iVar20) {
    pt = this_00->m_pointCache;
    lVar21 = 0;
    do {
      cbtPersistentManifold::clearUserCache(this_00,pt);
      auVar27 = in_ZMM25._0_16_;
      lVar21 = lVar21 + 1;
      iVar20 = this_00->m_cachedPoints;
      pt = pt + 1;
    } while (lVar21 < iVar20);
  }
  if (iVar20 != 0 && gContactEndedCallback != (ContactEndedCallback)0x0) {
    local_98.m_floats._0_8_ = this_00;
    (*gContactEndedCallback)((cbtPersistentManifold **)&local_98);
  }
  this_00->m_cachedPoints = 0;
  pcVar6 = body0->m_collisionObject;
  pcVar7 = pcVar22->m_collisionObject;
  cVar1 = (pcVar6->m_worldTransform).m_basis.m_el[0].m_floats[2];
  cVar2 = (pcVar7->m_worldTransform).m_basis.m_el[0].m_floats[2];
  auVar25 = vfmadd231ss_fma(ZEXT416((uint)((pcVar6->m_worldTransform).m_basis.m_el[1].m_floats[2] *
                                          (pcVar7->m_worldTransform).m_basis.m_el[1].m_floats[2])),
                            ZEXT416((uint)cVar1),ZEXT416((uint)cVar2));
  auVar25 = vfmadd231ss_fma(auVar25,ZEXT416((uint)(pcVar6->m_worldTransform).m_basis.m_el[2].
                                                  m_floats[2]),
                            ZEXT416((uint)(pcVar7->m_worldTransform).m_basis.m_el[2].m_floats[2]));
  auVar26._8_4_ = 0x7fffffff;
  auVar26._0_8_ = 0x7fffffff7fffffff;
  auVar26._12_4_ = 0x7fffffff;
  auVar25 = vandps_avx512vl(auVar25,auVar26);
  if (auVar25._0_4_ < 0.99) {
    return;
  }
  pcVar8 = body0->m_shape;
  pcVar9 = pcVar22->m_shape;
  fVar31 = (pcVar6->m_worldTransform).m_origin.m_floats[0];
  fVar36 = (pcVar7->m_worldTransform).m_origin.m_floats[0];
  fVar67 = (pcVar7->m_worldTransform).m_origin.m_floats[1];
  fVar34 = (pcVar7->m_worldTransform).m_origin.m_floats[2];
  fVar35 = (pcVar7->m_worldTransform).m_basis.m_el[1].m_floats[2];
  auVar25 = vfmadd231ss_fma(ZEXT416((uint)(((pcVar6->m_worldTransform).m_origin.m_floats[1] - fVar67
                                           ) * fVar35)),ZEXT416((uint)cVar2),
                            ZEXT416((uint)(fVar31 - fVar36)));
  auVar29 = ZEXT416((uint)(pcVar7->m_worldTransform).m_basis.m_el[2].m_floats[2]);
  auVar26 = vfmadd231ss_avx512f(auVar25,auVar29,
                                ZEXT416((uint)((pcVar6->m_worldTransform).m_origin.m_floats[2] -
                                              fVar34)));
  auVar25._8_4_ = 0x7fffffff;
  auVar25._0_8_ = 0x7fffffff7fffffff;
  auVar25._12_4_ = 0x7fffffff;
  auVar25 = vandps_avx512vl(auVar26,auVar25);
  if (*(float *)&pcVar8[2].field_0x1c + *(float *)&pcVar9[2].field_0x1c < auVar25._0_4_) {
    return;
  }
  fVar32 = (pcVar7->m_worldTransform).m_basis.m_el[1].m_floats[1];
  fVar33 = (pcVar7->m_worldTransform).m_basis.m_el[1].m_floats[0];
  uVar3 = *(uint *)((long)&pcVar8[2]._vptr_cbtCollisionShape + 4);
  uVar4 = pcVar8[2].m_shapeType;
  fVar5 = (pcVar6->m_worldTransform).m_basis.m_el[0].m_floats[0];
  auVar30 = ZEXT416((uint)(pcVar6->m_worldTransform).m_basis.m_el[0].m_floats[1]);
  auVar25 = vmulss_avx512f(ZEXT416(uVar4),auVar30);
  auVar25 = vfmadd231ss_avx512f(auVar25,ZEXT416(uVar3),ZEXT416((uint)fVar5));
  auVar27 = vxorps_avx512vl(auVar27,auVar27);
  auVar25 = vfmadd231ss_avx512f(auVar25,ZEXT416((uint)cVar1),auVar27);
  auVar63 = ZEXT416((uint)(pcVar6->m_worldTransform).m_basis.m_el[1].m_floats[1]);
  auVar26 = vmulss_avx512f(ZEXT416(uVar4),auVar63);
  auVar55 = ZEXT416((uint)(pcVar6->m_worldTransform).m_basis.m_el[1].m_floats[0]);
  auVar26 = vfmadd231ss_avx512f(auVar26,ZEXT416(uVar3),auVar55);
  auVar64 = ZEXT416((uint)(pcVar6->m_worldTransform).m_basis.m_el[1].m_floats[2]);
  auVar26 = vfmadd231ss_avx512f(auVar26,auVar64,auVar27);
  auVar66 = ZEXT416((uint)(pcVar6->m_worldTransform).m_basis.m_el[2].m_floats[1]);
  auVar28 = vmulss_avx512f(ZEXT416(uVar4),auVar66);
  auVar65 = ZEXT416((uint)(pcVar6->m_worldTransform).m_basis.m_el[2].m_floats[0]);
  auVar28 = vfmadd231ss_avx512f(auVar28,auVar65,ZEXT416(uVar3));
  auVar41 = ZEXT416((uint)(pcVar6->m_worldTransform).m_basis.m_el[2].m_floats[2]);
  auVar27 = vfmadd231ss_avx512f(auVar28,auVar41,auVar27);
  auVar25 = vaddss_avx512f(ZEXT416((uint)fVar31),auVar25);
  auVar26 = vaddss_avx512f(auVar26,ZEXT416((uint)(pcVar6->m_worldTransform).m_origin.m_floats[1]));
  fVar36 = auVar25._0_4_ - fVar36;
  auVar25 = vsubss_avx512f(auVar26,ZEXT416((uint)fVar67));
  fVar34 = (auVar27._0_4_ + (pcVar6->m_worldTransform).m_origin.m_floats[2]) - fVar34;
  fVar31 = auVar25._0_4_;
  auVar28 = ZEXT416((uint)(pcVar7->m_worldTransform).m_basis.m_el[0].m_floats[0]);
  auVar27 = vfmadd231ss_fma(ZEXT416((uint)(fVar33 * fVar31)),auVar28,ZEXT416((uint)fVar36));
  auVar54 = ZEXT416((uint)(pcVar7->m_worldTransform).m_basis.m_el[2].m_floats[0]);
  auVar25 = vfmadd231ss_fma(auVar27,auVar54,ZEXT416((uint)fVar34));
  auVar40 = ZEXT416((uint)(pcVar7->m_worldTransform).m_basis.m_el[0].m_floats[1]);
  auVar27 = vfmadd231ss_fma(ZEXT416((uint)(fVar31 * fVar32)),auVar40,ZEXT416((uint)fVar36));
  auVar53 = ZEXT416((uint)(pcVar7->m_worldTransform).m_basis.m_el[2].m_floats[1]);
  auVar26 = vfmadd231ss_fma(auVar27,auVar53,ZEXT416((uint)fVar34));
  auVar27 = vfmadd213ss_fma(ZEXT416((uint)cVar2),ZEXT416((uint)fVar36),
                            ZEXT416((uint)(fVar31 * fVar35)));
  auVar27 = vfmadd213ss_avx512f(auVar29,ZEXT416((uint)fVar34),auVar27);
  fVar67 = auVar27._0_4_;
  auVar62 = ZEXT816(0) << 0x20;
  auVar27 = vmulss_avx512f(auVar30,auVar62);
  auVar27 = vfmadd231ss_fma(ZEXT416((uint)(fVar5 + auVar27._0_4_)),auVar62,ZEXT416((uint)cVar1));
  auVar29 = vmulss_avx512f(auVar63,auVar62);
  auVar29 = vaddss_avx512f(auVar55,auVar29);
  auVar30 = vfmadd231ss_avx512f(auVar29,auVar62,auVar64);
  auVar29 = vmulss_avx512f(auVar66,auVar62);
  auVar29 = vaddss_avx512f(auVar65,auVar29);
  auVar29 = vfmadd231ss_fma(auVar29,auVar62,auVar41);
  auVar28 = vfmadd231ss_fma(ZEXT416((uint)(fVar33 * auVar30._0_4_)),auVar27,auVar28);
  auVar28 = vfmadd231ss_fma(auVar28,auVar29,auVar54);
  auVar27 = vfmadd231ss_fma(ZEXT416((uint)(fVar32 * auVar30._0_4_)),auVar40,auVar27);
  auVar27 = vfmadd231ss_fma(auVar27,auVar53,auVar29);
  fVar31 = atan2f(auVar27._0_4_,auVar28._0_4_);
  local_78 = (double)CONCAT44(local_78._4_4_,fVar31);
  auVar29 = vcvtss2sd_avx512f(in_XMM26,ZEXT416(*(uint *)&pcVar8[2].m_userPointer));
  auVar27 = vcvtss2sd_avx512f(in_XMM26,ZEXT416(*(uint *)((long)&pcVar8[2].m_userPointer + 4)));
  local_88 = auVar27._0_8_;
  fVar31 = *(float *)((long)&pcVar9[2]._vptr_cbtCollisionShape + 4);
  fVar36 = (float)pcVar9[2].m_shapeType;
  auVar28 = vcvtss2sd_avx512f(in_XMM26,ZEXT416(*(uint *)&pcVar9[2].m_userPointer));
  auVar30 = vcvtss2sd_avx512f(in_XMM26,ZEXT416(*(uint *)((long)&pcVar9[2].m_userPointer + 4)));
  fVar34 = auVar25._0_4_ - fVar31;
  fVar35 = auVar26._0_4_ - fVar36;
  auVar27 = vfmadd231ss_fma(ZEXT416((uint)(fVar35 * fVar35)),ZEXT416((uint)fVar34),
                            ZEXT416((uint)fVar34));
  auVar27 = vfmadd231ss_fma(auVar27,ZEXT416((uint)fVar67),ZEXT416((uint)fVar67));
  fVar32 = auVar27._0_4_;
  if (fVar32 < 0.0) {
    fVar33 = sqrtf(fVar32);
  }
  else {
    auVar27 = vsqrtss_avx(auVar27,auVar27);
    fVar33 = auVar27._0_4_;
  }
  if (fVar33 < 1e-08) {
    return;
  }
  fVar33 = 1.0 / fVar33;
  fVar5 = fVar34 * fVar33;
  auVar27 = ZEXT416((uint)fVar5);
  fVar10 = fVar35 * fVar33;
  auVar25 = ZEXT416((uint)fVar10);
  fVar67 = fVar67 * fVar33;
  fVar34 = atan2f(fVar35,fVar34);
  auVar60 = ZEXT1664(CONCAT88(extraout_XMM0_Qb,(double)fVar34));
  dVar37 = 0.0;
  if (((char)pcVar8[2].m_userIndex == '\0') && ((char)pcVar9[2].m_userIndex == '\0')) {
    auVar26 = vinsertps_avx(auVar27,auVar25,0x10);
    auVar53._4_8_ = SUB128(ZEXT812(0),4);
    auVar53._0_4_ = fVar67;
    auVar53._12_4_ = 0;
    local_60.m_floats = (cbtScalar  [4])vmovlhps_avx(auVar26,auVar53);
    fVar35 = *(float *)&pcVar9[2].field_0xc;
    auVar26 = vinsertps_avx(ZEXT416((uint)(fVar5 * fVar35 + fVar31)),
                            ZEXT416((uint)(fVar10 * fVar35 + fVar36)),0x10);
    local_98.m_floats =
         (cbtScalar  [4])vinsertps_avx(auVar26,ZEXT416((uint)(fVar67 * fVar35 + 0.0)),0x28);
    if (fVar32 < 0.0) {
      fVar35 = sqrtf(fVar32);
      auVar60 = ZEXT864((ulong)(double)fVar34);
    }
    else {
      auVar26 = vsqrtss_avx(ZEXT416((uint)fVar32),ZEXT416((uint)fVar32));
      fVar35 = auVar26._0_4_;
    }
    dVar59 = (double)((fVar35 - *(float *)&pcVar8[2].field_0xc) - *(float *)&pcVar9[2].field_0xc);
    dVar37 = auVar60._0_8_;
    dVar38 = dVar37 + 3.141592653589793;
    bVar13 = true;
  }
  else {
    bVar13 = false;
    dVar38 = 0.0;
    dVar59 = 0.0;
  }
  if ((((char)pcVar8[2].m_userIndex == '\0') && ((char)pcVar9[2].m_userIndex == '\x01')) &&
     (fVar34 = *(float *)&pcVar9[2].field_0xc, *(float *)&pcVar8[2].field_0xc <= fVar34)) {
    auVar26 = vinsertps_avx(ZEXT416((uint)(fVar5 * fVar34 + fVar31)),
                            ZEXT416((uint)(fVar10 * fVar34 + fVar36)),0x10);
    local_98.m_floats =
         (cbtScalar  [4])vinsertps_avx(auVar26,ZEXT416((uint)(fVar67 * fVar34 + 0.0)),0x28);
    auVar54._0_8_ = (ulong)(uint)fVar67 ^ 0x8000000080000000;
    auVar54._8_4_ = 0x80000000;
    auVar54._12_4_ = 0x80000000;
    auVar26 = vinsertps_avx(auVar27,auVar25,0x1c);
    auVar40._0_8_ = auVar26._0_8_ ^ 0x8000000080000000;
    auVar40._8_4_ = auVar26._8_4_ ^ 0x80000000;
    auVar40._12_4_ = auVar26._12_4_ ^ 0x80000000;
    local_60.m_floats = (cbtScalar  [4])vinsertps_avx(auVar40,auVar54,0x28);
    if (fVar32 < 0.0) {
      auVar43._0_4_ = sqrtf(fVar32);
      auVar43._4_60_ = extraout_var;
      auVar26 = auVar43._0_16_;
      auVar60 = ZEXT864(auVar60._0_8_);
    }
    else {
      auVar26 = vsqrtss_avx(ZEXT416((uint)fVar32),ZEXT416((uint)fVar32));
    }
    auVar62._8_4_ = 0x80000000;
    auVar62._0_8_ = 0x8000000080000000;
    auVar62._12_4_ = 0x80000000;
    auVar26 = vxorps_avx512vl(auVar26,auVar62);
    dVar59 = (double)((auVar26._0_4_ - *(float *)&pcVar8[2].field_0xc) +
                     *(float *)&pcVar9[2].field_0xc);
    bVar13 = true;
    dVar37 = auVar60._0_8_;
    dVar38 = dVar37;
  }
  if ((((char)pcVar8[2].m_userIndex == '\x01') && ((char)pcVar9[2].m_userIndex == '\0')) &&
     (fVar34 = *(float *)&pcVar9[2].field_0xc, fVar34 <= *(float *)&pcVar8[2].field_0xc)) {
    auVar26 = vinsertps_avx(ZEXT416((uint)(fVar31 - fVar5 * fVar34)),
                            ZEXT416((uint)(fVar36 - fVar10 * fVar34)),0x10);
    local_98.m_floats =
         (cbtScalar  [4])vinsertps_avx(auVar26,ZEXT416((uint)(0.0 - fVar67 * fVar34)),0x28);
    auVar55._0_8_ = (ulong)(uint)fVar67 ^ 0x8000000080000000;
    auVar55._8_4_ = 0x80000000;
    auVar55._12_4_ = 0x80000000;
    auVar27 = vinsertps_avx(auVar27,auVar25,0x1c);
    auVar41._0_8_ = auVar27._0_8_ ^ 0x8000000080000000;
    auVar41._8_4_ = auVar27._8_4_ ^ 0x80000000;
    auVar41._12_4_ = auVar27._12_4_ ^ 0x80000000;
    local_60.m_floats = (cbtScalar  [4])vinsertps_avx(auVar41,auVar55,0x28);
    if (fVar32 < 0.0) {
      fVar31 = sqrtf(fVar32);
      auVar60 = ZEXT864(auVar60._0_8_);
    }
    else {
      auVar27 = vsqrtss_avx(ZEXT416((uint)fVar32),ZEXT416((uint)fVar32));
      fVar31 = auVar27._0_4_;
    }
    dVar59 = (double)((*(float *)&pcVar8[2].field_0xc - fVar31) - *(float *)&pcVar9[2].field_0xc);
    dVar37 = auVar60._0_8_ + 3.141592653589793;
    bVar13 = true;
    dVar38 = dVar37;
  }
  auVar61 = auVar60._4_12_;
  if (!bVar13) {
    return;
  }
  auVar27 = vcvtss2sd_avx512f(in_XMM26,ZEXT416(local_78._0_4_));
  dVar39 = auVar27._0_8_ + local_88;
  auVar60._0_8_ = fmod(auVar27._0_8_ + auVar29._0_8_,6.283185307179586);
  auVar60._8_56_ = extraout_var_00;
  uVar12 = vcmpsd_avx512f(auVar60._0_16_,ZEXT816(0) << 0x40,1);
  bVar13 = (bool)((byte)uVar12 & 1);
  auVar44._0_8_ = fmod(dVar39,6.283185307179586);
  auVar44._8_56_ = extraout_var_01;
  uVar12 = vcmpsd_avx512f(auVar44._0_16_,ZEXT816(0),1);
  bVar14 = (bool)((byte)uVar12 & 1);
  auVar45._0_8_ = fmod(auVar28._0_8_,6.283185307179586);
  auVar45._8_56_ = extraout_var_02;
  uVar12 = vcmpsd_avx512f(auVar45._0_16_,ZEXT816(0),1);
  bVar15 = (bool)((byte)uVar12 & 1);
  auVar46._0_8_ = fmod(auVar30._0_8_,6.283185307179586);
  auVar46._8_56_ = extraout_var_03;
  uVar12 = vcmpsd_avx512f(auVar46._0_16_,ZEXT816(0),1);
  bVar16 = (bool)((byte)uVar12 & 1);
  local_78 = (double)((ulong)bVar16 * (long)(auVar46._0_8_ + 6.283185307179586) +
                     (ulong)!bVar16 * (long)auVar46._0_8_);
  uStack_70 = extraout_var_03._0_8_;
  auVar47._0_8_ = fmod(dVar38,6.283185307179586);
  auVar47._8_56_ = extraout_var_04;
  uVar12 = vcmpsd_avx512f(auVar47._0_16_,ZEXT816(0),1);
  bVar16 = (bool)((byte)uVar12 & 1);
  auVar48._0_8_ = fmod(dVar37,6.283185307179586);
  auVar48._8_56_ = extraout_var_05;
  uVar12 = vcmpsd_avx512f(auVar48._0_16_,ZEXT816(0),1);
  bVar17 = (bool)((byte)uVar12 & 1);
  local_88 = (double)((ulong)bVar17 * (long)(auVar48._0_8_ + 6.283185307179586) +
                     (ulong)!bVar17 * (long)auVar48._0_8_);
  uStack_80 = extraout_var_05._0_8_;
  dVar37 = fmod((double)((ulong)bVar13 * (long)(auVar60._0_8_ + 6.283185307179586) +
                        (ulong)!bVar13 * (long)auVar60._0_8_),6.283185307179586);
  local_118._0_8_ =
       fmod((double)((ulong)bVar14 * (long)(auVar44._0_8_ + 6.283185307179586) +
                    (ulong)!bVar14 * (long)auVar44._0_8_),6.283185307179586);
  local_118._8_8_ = extraout_XMM0_Qb_01;
  local_138._0_8_ =
       fmod((double)((ulong)bVar15 * (long)(auVar45._0_8_ + 6.283185307179586) +
                    (ulong)!bVar15 * (long)auVar45._0_8_),6.283185307179586);
  local_138._8_8_ = extraout_XMM0_Qb_02;
  dVar38 = fmod(local_78,6.283185307179586);
  dVar39 = fmod((double)((ulong)bVar16 * (long)(auVar47._0_8_ + 6.283185307179586) +
                        (ulong)!bVar16 * (long)auVar47._0_8_),6.283185307179586);
  auVar49._0_8_ = fmod(local_88,6.283185307179586);
  auVar49._8_56_ = extraout_var_06;
  if ((char)pcVar8[2].m_userIndex == '\x01') {
    auVar30._8_8_ = extraout_XMM0_Qb_00;
    auVar30._0_8_ = dVar37;
    if ((double)local_118._0_8_ <= dVar37) {
      auVar63._8_8_ = extraout_XMM0_Qb_04;
      auVar63._0_8_ = dVar39;
      uVar12 = vcmppd_avx512vl(auVar63,local_118,2);
      bVar23 = (byte)uVar12;
      uVar12 = vcmppd_avx512vl(auVar30,auVar63,2);
      bVar24 = (byte)uVar12;
LAB_00808e49:
      bVar23 = bVar24 & 3 | bVar23 & 3;
    }
    else {
      auVar64._8_8_ = extraout_XMM0_Qb_04;
      auVar64._0_8_ = dVar39;
      uVar12 = vcmppd_avx512vl(auVar30,auVar64,2);
      uVar11 = vcmppd_avx512vl(auVar64,local_118,2);
      bVar23 = (byte)uVar12 & 3 & (byte)uVar11;
    }
  }
  else {
    auVar27._8_8_ = extraout_XMM0_Qb_00;
    auVar27._0_8_ = dVar37;
    if (dVar37 < (double)local_118._0_8_) {
      auVar29._8_8_ = extraout_XMM0_Qb_04;
      auVar29._0_8_ = dVar39;
      uVar12 = vcmppd_avx512vl(auVar29,auVar27,2);
      bVar23 = (byte)uVar12;
      uVar12 = vcmppd_avx512vl(local_118,auVar29,2);
      bVar24 = (byte)uVar12;
      goto LAB_00808e49;
    }
    auVar28._8_8_ = extraout_XMM0_Qb_04;
    auVar28._0_8_ = dVar39;
    uVar12 = vcmppd_avx512vl(local_118,auVar28,2);
    uVar11 = vcmppd_avx512vl(auVar28,auVar27,2);
    bVar23 = (byte)uVar12 & 3 & (byte)uVar11;
  }
  auVar58 = ZEXT856(extraout_XMM0_Qb_00);
  auVar65._8_8_ = extraout_XMM0_Qb_03;
  auVar65._0_8_ = dVar38;
  auVar27 = auVar49._0_16_;
  if ((char)pcVar9[2].m_userIndex == '\x01') {
    if ((double)local_138._0_8_ < dVar38) {
      uVar12 = vcmppd_avx512vl(local_138,auVar27,2);
      uVar11 = vcmppd_avx512vl(auVar27,auVar65,2);
      bVar24 = (byte)uVar12 & 3 & (byte)uVar11;
      goto LAB_00808ec7;
    }
    uVar12 = vcmppd_avx512vl(auVar27,auVar65,2);
    bVar24 = (byte)uVar12;
    uVar12 = vcmppd_avx512vl(local_138,auVar27,2);
    bVar19 = (byte)uVar12;
  }
  else {
    if (dVar38 <= (double)local_138._0_8_) {
      uVar12 = vcmppd_avx512vl(auVar65,auVar27,2);
      uVar11 = vcmppd_avx512vl(auVar27,local_138,2);
      bVar24 = (byte)uVar12 & 3 & (byte)uVar11;
      goto LAB_00808ec7;
    }
    uVar12 = vcmppd_avx512vl(auVar27,local_138,2);
    bVar24 = (byte)uVar12;
    uVar12 = vcmppd_avx512vl(auVar65,auVar27,2);
    bVar19 = (byte)uVar12;
  }
  bVar24 = bVar19 & 3 | bVar24 & 3;
LAB_00808ec7:
  if ((bVar23 & bVar24 & 1) != 0) {
    auVar52 = extraout_var_06;
    cVar68 = cbtTransform::operator*(&pcVar7->m_worldTransform,&local_98);
    auVar56._0_8_ = cVar68.m_floats._8_8_;
    auVar56._8_56_ = auVar58;
    auVar50._0_8_ = cVar68.m_floats._0_8_;
    auVar50._8_56_ = auVar52;
    local_40 = vunpcklpd_avx(auVar50._0_16_,auVar56._0_16_);
    auVar52 = ZEXT856(local_40._8_8_);
    cVar68 = ::operator*(&(pcVar7->m_worldTransform).m_basis,&local_60);
    auVar57._0_8_ = cVar68.m_floats._8_8_;
    auVar57._8_56_ = auVar58;
    auVar51._0_8_ = cVar68.m_floats._0_8_;
    auVar51._8_56_ = auVar52;
    local_50 = vunpcklpd_avx(auVar51._0_16_,auVar57._0_16_);
    auVar18._8_8_ = 0;
    auVar18._0_8_ = dVar59;
    auVar66._8_4_ = 0xffffffff;
    auVar66._0_8_ = 0x7fffffffffffffff;
    auVar66._12_4_ = 0x7fffffff;
    auVar27 = vandpd_avx512vl(auVar18,auVar66);
    fVar36 = auVar27._0_4_;
    (*pcVar8->_vptr_cbtCollisionShape[0xc])(pcVar8);
    fVar31 = fVar36;
    (*pcVar9->_vptr_cbtCollisionShape[0xc])(pcVar9);
    local_138._0_8_ = auVar27._0_8_;
    if ((double)local_138._0_8_ <= (double)(fVar31 + fVar36)) {
      auVar42._0_4_ = (float)dVar59;
      auVar42._4_12_ = auVar61;
      (*(resultOut->super_Result)._vptr_Result[4])(auVar42._0_8_,resultOut,local_50,local_40);
      cbtManifoldResult::refreshContactPoints(resultOut);
    }
  }
  return;
}

Assistant:

void cbtArcArcCollisionAlgorithm::processCollision(const cbtCollisionObjectWrapper* body0,
                                                   const cbtCollisionObjectWrapper* body1,
                                                   const cbtDispatcherInfo& dispatchInfo,
                                                   cbtManifoldResult* resultOut) {
    (void)dispatchInfo;
    (void)resultOut;
    if (!m_manifoldPtr)
        return;

    const cbtCollisionObjectWrapper* arcObj1Wrap = m_isSwapped ? body1 : body0;
    const cbtCollisionObjectWrapper* arcObj2Wrap = m_isSwapped ? body0 : body1;

    resultOut->setPersistentManifold(m_manifoldPtr);

    // only 1 contact per pair, avoid persistence
    resultOut->getPersistentManifold()->clearManifold();

    const cbt2DarcShape* arc1 = (cbt2DarcShape*)arcObj1Wrap->getCollisionShape();
    const cbt2DarcShape* arc2 = (cbt2DarcShape*)arcObj2Wrap->getCollisionShape();

    const cbtTransform& m44Tarc1 = arcObj1Wrap->getCollisionObject()->getWorldTransform();
    const cbtTransform& m44Tarc2 = arcObj2Wrap->getCollisionObject()->getWorldTransform();

    // Shapes on two planes that are not so parallel? no collisions!
    cbtVector3 Zarc1 = m44Tarc1.getBasis().getColumn(2);
    cbtVector3 Zarc2 = m44Tarc2.getBasis().getColumn(2);
    if (fabs(Zarc1.dot(Zarc2)) < 0.99)  //***TODO*** threshold as setting
        return;

    // Shapes on two planes that are too far? no collisions!
    cbtVector3 diff = m44Tarc2.invXform(m44Tarc1.getOrigin());
    if (fabs(diff.getZ()) > (arc1->get_zthickness() + arc2->get_zthickness()))
        return;

    // vectors and angles of arc 1 in arc 2 csys:
    cbtVector3 local_arc1_center = m44Tarc2.invXform(m44Tarc1 * cbtVector3(arc1->get_X(), arc1->get_Y(), 0));
    cbtVector3 local_arc1_X = m44Tarc2.getBasis().transpose() * (m44Tarc1.getBasis() * cbtVector3(1, 0, 0));
    double local_arc1_rot = atan2(local_arc1_X.getY(), local_arc1_X.getX());
    double arc1_angle1 = local_arc1_rot + arc1->get_angle1();
    double arc1_angle2 = local_arc1_rot + arc1->get_angle2();

    cbtVector3 local_arc2_center = cbtVector3(arc2->get_X(), arc2->get_Y(), 0);
    double arc2_angle1 = arc2->get_angle1();
    double arc2_angle2 = arc2->get_angle2();

    cbtVector3 local_C1C2 = local_arc1_center - local_arc2_center;
    auto len = local_C1C2.length();
    if (len < 1e-8)
        return;
    cbtVector3 local_D12 = local_C1C2 / len;

    cbtVector3 local_P1;
    cbtVector3 local_P2;
    cbtVector3 local_N2;
    double dist = 0;
    bool paired = false;
    double alpha = atan2(local_C1C2.getY(), local_C1C2.getX());
    double alpha1 = 0, alpha2 = 0;

    // convex-convex
    if (arc1->get_counterclock() == false && arc2->get_counterclock() == false) {
        local_P1 = local_arc1_center - local_D12 * arc1->get_radius();
        local_P2 = local_arc2_center + local_D12 * arc2->get_radius();
        local_N2 = local_D12;
        dist = local_C1C2.length() - arc1->get_radius() - arc2->get_radius();
        alpha1 = alpha + CH_C_PI;
        alpha2 = alpha;
        paired = true;
    }
    // convex-concave
    if (arc1->get_counterclock() == false && arc2->get_counterclock() == true)
        if (arc1->get_radius() <= arc2->get_radius()) {
            local_P1 = local_arc1_center + local_D12 * arc1->get_radius();
            local_P2 = local_arc2_center + local_D12 * arc2->get_radius();
            local_N2 = -local_D12;
            dist = -local_C1C2.length() - arc1->get_radius() + arc2->get_radius();
            alpha1 = alpha;
            alpha2 = alpha;
            paired = true;
        }
    // concave-convex
    if (arc1->get_counterclock() == true && arc2->get_counterclock() == false)
        if (arc1->get_radius() >= arc2->get_radius()) {
            local_P1 = local_arc1_center - local_D12 * arc1->get_radius();
            local_P2 = local_arc2_center - local_D12 * arc2->get_radius();
            local_N2 = -local_D12;
            dist = -local_C1C2.length() + arc1->get_radius() - arc2->get_radius();
            alpha1 = alpha + CH_C_PI;
            alpha2 = alpha + CH_C_PI;
            paired = true;
        }

    if (!paired)
        return;

    // Discard points out of min-max angles

    // to always positive angles:
    arc1_angle1 = fmod(arc1_angle1, CH_C_2PI);
    if (arc1_angle1 < 0)
        arc1_angle1 += CH_C_2PI;
    arc1_angle2 = fmod(arc1_angle2, CH_C_2PI);
    if (arc1_angle2 < 0)
        arc1_angle2 += CH_C_2PI;
    arc2_angle1 = fmod(arc2_angle1, CH_C_2PI);
    if (arc2_angle1 < 0)
        arc2_angle1 += CH_C_2PI;
    arc2_angle2 = fmod(arc2_angle2, CH_C_2PI);
    if (arc2_angle2 < 0)
        arc2_angle2 += CH_C_2PI;
    alpha1 = fmod(alpha1, CH_C_2PI);
    if (alpha1 < 0)
        alpha1 += CH_C_2PI;
    alpha2 = fmod(alpha2, CH_C_2PI);
    if (alpha2 < 0)
        alpha2 += CH_C_2PI;

    arc1_angle1 = fmod(arc1_angle1, CH_C_2PI);
    arc1_angle2 = fmod(arc1_angle2, CH_C_2PI);
    arc2_angle1 = fmod(arc2_angle1, CH_C_2PI);
    arc2_angle2 = fmod(arc2_angle2, CH_C_2PI);
    alpha1 = fmod(alpha1, CH_C_2PI);
    alpha2 = fmod(alpha2, CH_C_2PI);

    bool inangle1 = false;
    bool inangle2 = false;

    if (arc1->get_counterclock() == true) {
        if (arc1_angle1 < arc1_angle2) {
            if (alpha1 >= arc1_angle1 && alpha1 <= arc1_angle2)
                inangle1 = true;
        } else {
            if (alpha1 >= arc1_angle1 || alpha1 <= arc1_angle2)
                inangle1 = true;
        }
    } else {
        if (arc1_angle1 < arc1_angle2) {
            if (alpha1 >= arc1_angle2 || alpha1 <= arc1_angle1)
                inangle1 = true;
        } else {
            if (alpha1 >= arc1_angle2 && alpha1 <= arc1_angle1)
                inangle1 = true;
        }
    }

    if (arc2->get_counterclock() == true) {
        if (arc2_angle1 < arc2_angle2) {
            if (alpha2 >= arc2_angle1 && alpha2 <= arc2_angle2)
                inangle2 = true;
        } else {
            if (alpha2 >= arc2_angle1 || alpha2 <= arc2_angle2)
                inangle2 = true;
        }
    } else {
        if (arc2_angle1 < arc2_angle2) {
            if (alpha2 >= arc2_angle2 || alpha2 <= arc2_angle1)
                inangle2 = true;
        } else {
            if (alpha2 >= arc2_angle2 && alpha2 <= arc2_angle1)
                inangle2 = true;
        }
    }

    if (!(inangle1 && inangle2))
        return;

    // transform in absolute coords:
    cbtVector3 pos2 = m44Tarc2 * local_P2;
    cbtVector3 normal_on_2 = m44Tarc2.getBasis() * local_N2;

    // too far or too interpenetrate? discard.
    if (fabs(dist) > (arc1->getMargin() + arc2->getMargin()))
        return;

    /// report a contact.
    resultOut->addContactPoint(normal_on_2, pos2, (cbtScalar)dist);

    resultOut->refreshContactPoints();
}